

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<char16_t>
          (BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,char16_t *key)

{
  SimpleDictionaryEntry<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>_> *pSVar1;
  uint uVar2;
  int *piVar3;
  Type this_00;
  int iVar4;
  long lVar5;
  
  piVar3 = (this->buckets).ptr;
  if (piVar3 == (int *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = GetBucket(this,(uint)(ushort)*key * 2 + 1);
    pSVar1 = (this->entries).ptr;
    piVar3 = piVar3 + uVar2;
    uVar2 = 0;
    while( true ) {
      iVar4 = *piVar3;
      lVar5 = (long)iVar4;
      if (lVar5 < 0) break;
      if (pSVar1[lVar5].
          super_DefaultHashedEntry<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>_>.
          super_ValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>_>_>
          .super_KeyValueEntryDataLayout2<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>_>.
          key == *key) {
        this_00 = this->stats;
        goto LAB_006c174f;
      }
      uVar2 = uVar2 + 1;
      piVar3 = &pSVar1[lVar5].
                super_DefaultHashedEntry<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>_>.
                super_ValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>_>_>
                .
                super_KeyValueEntryDataLayout2<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>_>
                .next;
    }
  }
  this_00 = this->stats;
  iVar4 = -1;
LAB_006c174f:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  return iVar4;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }